

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void sensors_analytics::Sdk::ProfileSetOnceBool(string *property_name,bool bool_value)

{
  Sdk *this;
  Sdk *pSVar1;
  PropertiesNode properties_node;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  ObjectNode local_48;
  
  if (instance_ != (Sdk *)0x0) {
    local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48._vptr_ObjectNode = (_func_int **)&PTR_SetList_00125d50;
    local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    utils::ObjectNode::SetBool(&local_48,property_name,bool_value);
    this = instance_;
    std::__cxx11::string::string((string *)&local_68,"profile_set_once",&local_a9);
    std::__cxx11::string::string((string *)&local_88,"",&local_aa);
    pSVar1 = instance_;
    std::__cxx11::string::string((string *)&local_a8,"",&local_ab);
    AddEvent(this,&local_68,&local_88,&local_48,&pSVar1->distinct_id_,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    utils::ObjectNode::~ObjectNode(&local_48);
  }
  return;
}

Assistant:

void Sdk::ProfileSetOnceBool(const string &property_name, bool bool_value) {
  if (instance_) {
    PropertiesNode properties_node;
    properties_node.SetBool(property_name, bool_value);
    instance_->AddEvent("profile_set_once",
                        "",
                        properties_node,
                        instance_->distinct_id_,
                        "");
  }
}